

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

void Curl_cpool_xfer_init(Curl_easy *data)

{
  Curl_share *pCVar1;
  long lVar2;
  Curl_easy *pCVar3;
  Curl_multi *pCVar4;
  cpool *pcVar5;
  
  if (data == (Curl_easy *)0x0) {
LAB_0011910c:
    data->id = 0;
    (data->state).lastconnect_id = -1;
  }
  else {
    pCVar1 = data->share;
    if ((pCVar1 == (Curl_share *)0x0) || ((pCVar1->specifier & 0x20) == 0)) {
      pCVar4 = data->multi_easy;
      if ((pCVar4 == (Curl_multi *)0x0) && (pCVar4 = data->multi, pCVar4 == (Curl_multi *)0x0))
      goto LAB_0011910c;
      pcVar5 = &pCVar4->cpool;
    }
    else {
      pcVar5 = &pCVar1->cpool;
    }
    if ((pcVar5->share != (Curl_share *)0x0) && ((pcVar5->share->specifier & 0x20) != 0)) {
      Curl_share_lock(pcVar5->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    pcVar5->field_0x98 = pcVar5->field_0x98 | 1;
    lVar2 = pcVar5->next_easy_id;
    pcVar5->next_easy_id = lVar2 + 1;
    data->id = lVar2;
    if (lVar2 < 0) {
      pcVar5->next_easy_id = 0;
    }
    (data->state).lastconnect_id = -1;
    pCVar3 = pcVar5->idata;
    (pCVar3->set).timeout = (data->set).timeout;
    (pCVar3->set).server_response_timeout = (data->set).server_response_timeout;
    *(ulong *)&(pCVar3->set).field_0x8ca =
         *(ulong *)&(pCVar3->set).field_0x8ca & 0xffffffff7fffffff |
         (ulong)((uint)*(undefined8 *)&(data->set).field_0x8ca & 0x80000000);
    pcVar5->field_0x98 = pcVar5->field_0x98 & 0xfe;
    if ((pcVar5->share != (Curl_share *)0x0) && ((pcVar5->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(pcVar5->idata,CURL_LOCK_DATA_CONNECT);
      return;
    }
  }
  return;
}

Assistant:

void Curl_cpool_xfer_init(struct Curl_easy *data)
{
  struct cpool *cpool = cpool_get_instance(data);

  DEBUGASSERT(cpool);
  if(cpool) {
    CPOOL_LOCK(cpool);
    /* the identifier inside the connection cache */
    data->id = cpool->next_easy_id++;
    if(cpool->next_easy_id <= 0)
      cpool->next_easy_id = 0;
    data->state.lastconnect_id = -1;

    /* The closure handle only ever has default timeouts set. To improve the
       state somewhat we clone the timeouts from each added handle so that the
       closure handle always has the same timeouts as the most recently added
       easy handle. */
    cpool->idata->set.timeout = data->set.timeout;
    cpool->idata->set.server_response_timeout =
      data->set.server_response_timeout;
    cpool->idata->set.no_signal = data->set.no_signal;

    CPOOL_UNLOCK(cpool);
  }
  else {
    /* We should not get here, but in a non-debug build, do something */
    data->id = 0;
    data->state.lastconnect_id = -1;
  }
}